

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.hpp
# Opt level: O0

void duckdb::BitpackingPrimitives::SignExtend<long,unsigned_long>
               (data_ptr_t dst,bitpacking_width_t width)

{
  byte in_SIL;
  long in_RDI;
  long result;
  long value;
  idx_t i;
  long mask;
  long local_30;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  byte local_9;
  long local_8;
  
  local_9 = in_SIL;
  local_8 = in_RDI;
  local_18 = UnsafeNumericCast<long,unsigned_long,void>(1L << (in_SIL - 1 & 0x3f));
  for (local_20 = 0; local_20 < 0x20; local_20 = local_20 + 1) {
    local_28 = Load<long>((const_data_ptr_t)(local_8 + local_20 * 8));
    local_28 = UnsafeNumericCast<long,unsigned_long,void>(local_28 & (1L << (local_9 & 0x3f)) - 1U);
    local_30 = (local_28 ^ local_18) - local_18;
    Store<long>(&local_30,(data_ptr_t)(local_8 + local_20 * 8));
  }
  return;
}

Assistant:

static void SignExtend(data_ptr_t dst, bitpacking_width_t width) {
		T const mask = UnsafeNumericCast<T>(T_U(1) << (width - 1));
		for (idx_t i = 0; i < BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE; ++i) {
			T value = Load<T>(dst + i * sizeof(T));
			value = UnsafeNumericCast<T>(T_U(value) & ((T_U(1) << width) - T_U(1)));
			T result = (value ^ mask) - mask;
			Store(result, dst + i * sizeof(T));
		}
	}